

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O2

void duckdb::ConstructPivots
               (PivotRef *ref,vector<duckdb::PivotValueElement,_true> *pivot_values,idx_t pivot_idx,
               PivotValueElement *current_value)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  reference pvVar4;
  reference __x;
  idx_t v;
  ulong __n;
  pointer this;
  string *this_00;
  string name;
  string local_a8;
  PivotValueElement new_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar4 = vector<duckdb::PivotColumn,_true>::get<true>(&ref->pivots,pivot_idx);
  pPVar1 = (ref->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
           super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar2 = (ref->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
           super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar3 = (pvVar4->entries).
           super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
           super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this = (pvVar4->entries).
              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
              ._M_impl.super__Vector_impl_data._M_start; this != pPVar3; this = this + 1) {
    PivotValueElement::PivotValueElement(&new_value,current_value);
    ::std::__cxx11::string::string((string *)&name,(string *)&this->alias);
    for (__n = 0; __n < (ulong)((long)(this->values).
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->values).
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 6); __n = __n + 1
        ) {
      __x = vector<duckdb::Value,_true>::get<true>(&this->values,__n);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&new_value,__x);
      if ((this->alias)._M_string_length == 0) {
        if (name._M_string_length == 0) {
          Value::ToString_abi_cxx11_(&local_50,__x);
          ::std::__cxx11::string::operator=((string *)&name,(string *)&local_50);
          this_00 = &local_50;
        }
        else {
          Value::ToString_abi_cxx11_(&local_a8,__x);
          ::std::operator+(&local_50,"_",&local_a8);
          ::std::__cxx11::string::append((string *)&name);
          ::std::__cxx11::string::~string((string *)&local_50);
          this_00 = &local_a8;
        }
        ::std::__cxx11::string::~string((string *)this_00);
      }
    }
    if ((current_value->name)._M_string_length == 0) {
      ::std::__cxx11::string::operator=((string *)&new_value.name,(string *)&name);
    }
    else {
      ::std::operator+(&local_a8,&current_value->name,"_");
      ::std::operator+(&local_50,&local_a8,&name);
      ::std::__cxx11::string::operator=((string *)&new_value.name,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_a8);
    }
    if (pivot_idx + 1 == ((long)pPVar1 - (long)pPVar2) / 0x70) {
      ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::
      emplace_back<duckdb::PivotValueElement>
                (&pivot_values->
                  super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                 ,&new_value);
    }
    else {
      ConstructPivots(ref,pivot_values,pivot_idx + 1,&new_value);
    }
    ::std::__cxx11::string::~string((string *)&name);
    PivotValueElement::~PivotValueElement(&new_value);
  }
  return;
}

Assistant:

static void ConstructPivots(PivotRef &ref, vector<PivotValueElement> &pivot_values, idx_t pivot_idx = 0,
                            const PivotValueElement &current_value = PivotValueElement()) {
	auto &pivot = ref.pivots[pivot_idx];
	bool last_pivot = pivot_idx + 1 == ref.pivots.size();
	for (auto &entry : pivot.entries) {
		PivotValueElement new_value = current_value;
		string name = entry.alias;
		D_ASSERT(entry.values.size() == pivot.pivot_expressions.size());
		for (idx_t v = 0; v < entry.values.size(); v++) {
			auto &value = entry.values[v];
			new_value.values.push_back(value);
			if (entry.alias.empty()) {
				if (name.empty()) {
					name = value.ToString();
				} else {
					name += "_" + value.ToString();
				}
			}
		}
		if (!current_value.name.empty()) {
			new_value.name = current_value.name + "_" + name;
		} else {
			new_value.name = std::move(name);
		}
		if (last_pivot) {
			pivot_values.push_back(std::move(new_value));
		} else {
			// need to recurse
			ConstructPivots(ref, pivot_values, pivot_idx + 1, new_value);
		}
	}
}